

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath_p.h
# Opt level: O0

void __thiscall QPainterPathPrivate::clear(QPainterPathPrivate *this)

{
  QVarLengthArray<QPainterPath::ElementType,_256LL> *pQVar1;
  pointer in_RDI;
  long in_FS_OFFSET;
  pointer this_00;
  QRectF local_48;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QList<QPainterPath::Element>::clear((QList<QPainterPath::Element> *)in_RDI);
  QList<double>::clear((QList<double> *)this_00);
  pQVar1 = &(in_RDI->pathData).elements;
  (pQVar1->super_QVLAStorage<4UL,_4UL,_256LL>).array[0x68] = '\0';
  (pQVar1->super_QVLAStorage<4UL,_4UL,_256LL>).array[0x69] = '\0';
  (pQVar1->super_QVLAStorage<4UL,_4UL,_256LL>).array[0x6a] = '\0';
  (pQVar1->super_QVLAStorage<4UL,_4UL,_256LL>).array[0x6b] = '\0';
  QRectF::QRectF(&local_28);
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x38) =
       local_28.w;
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x40) =
       local_28.h;
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x28) =
       local_28.xp;
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x30) =
       local_28.yp;
  QRectF::QRectF(&local_48);
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x58) =
       local_48.w;
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x60) =
       local_48.h;
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x48) =
       local_48.xp;
  *(qreal *)((in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array + 0x50) =
       local_48.yp;
  (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] =
       (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] & 0xfe;
  (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] =
       (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] & 0xfd;
  (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] =
       (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] & 0xfb;
  (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] =
       (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] & 0xf7;
  (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] =
       (in_RDI->pathData).elements.super_QVLAStorage<4UL,_4UL,_256LL>.array[0x6c] & 0xef;
  std::unique_ptr<QVectorPathConverter,_std::default_delete<QVectorPathConverter>_>::reset
            ((unique_ptr<QVectorPathConverter,_std::default_delete<QVectorPathConverter>_> *)this_00
             ,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainterPathPrivate::clear()
{
    Q_ASSERT(ref.loadRelaxed() == 1);

    elements.clear();
    m_runLengths.clear();

    cStart = 0;
    bounds = {};
    controlBounds = {};

    require_moveTo = false;
    dirtyBounds = false;
    dirtyControlBounds = false;
    dirtyRunLengths = false;
    convex = false;

    pathConverter.reset();
}